

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O0

TProb<double> * __thiscall libDAI::TProb<double>::operator*(TProb<double> *this,TProb<double> *q)

{
  TProb<double> *in_RDI;
  TProb<double> *prod;
  TProb<double> *in_stack_ffffffffffffffb8;
  TProb<double> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = 0;
  TProb(in_RDI,in_stack_ffffffffffffffb8);
  operator*=((TProb<double> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

TProb<T> operator* (const TProb<T> & q) const {
#ifdef DEBUG
                assert( size() == q.size() );
#endif
                TProb<T> prod( *this );
                prod *= q;
                return prod;
            }